

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# touzet_depth_pruning_truncated_tree_fix_tree_index_impl.h
# Opt level: O1

double __thiscall
ted::
TouzetDepthPruningTruncatedTreeFixTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
::tree_dist(TouzetDepthPruningTruncatedTreeFixTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
            *this,TreeIndexAll *t1,TreeIndexAll *t2,int x,int y,int k,int e)

{
  BandMatrix<double> *this_00;
  longlong *plVar1;
  int iVar2;
  int iVar3;
  pointer piVar4;
  int *piVar5;
  int iVar6;
  uint uVar7;
  double *pdVar8;
  double *pdVar9;
  undefined8 uVar10;
  undefined4 in_register_0000000c;
  long lVar11;
  long lVar12;
  size_t sVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  size_t sVar19;
  uint uVar20;
  ulong uVar21;
  pointer piVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  vector<int,_std::allocator<int>_> nodes_to_traverse;
  vector<int,_std::allocator<int>_> local_128;
  long local_108;
  long local_100;
  ulong local_f8;
  ulong local_f0;
  TreeIndexAll *local_e8;
  uint local_dc;
  int local_d8;
  int local_d4;
  double local_d0 [3];
  ulong local_b8;
  ulong local_b0;
  long local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  int *local_88;
  long local_80;
  size_t local_78;
  ulong local_70;
  Matrix<double> *local_68;
  size_t local_60;
  ulong local_58;
  double local_50;
  double local_48;
  undefined8 uStack_40;
  
  local_f8 = CONCAT44(in_register_0000000c,x);
  uVar21 = (ulong)x;
  iVar2 = (t1->super_PostLToSize).postl_to_size_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar21];
  local_100 = CONCAT44(local_100._4_4_,y);
  local_a8 = (long)y;
  iVar14 = (t2->super_PostLToSize).postl_to_size_.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start[local_a8];
  this_00 = &(this->
             super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
             ).
             super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
             .fd_;
  local_e8 = t2;
  local_d4 = k;
  pdVar8 = data_structures::Matrix<double>::at
                     (&this_00->super_Matrix<double>,0,
                      (this->
                      super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                      ).
                      super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                      .fd_.band_width_);
  *pdVar8 = 0.0;
  iVar17 = e;
  if (iVar14 < e) {
    iVar17 = iVar14;
  }
  local_108 = (long)iVar14;
  if (0 < iVar17) {
    uVar18 = 1;
    do {
      pdVar8 = data_structures::Matrix<double>::read_at
                         (&this_00->super_Matrix<double>,0,
                          (uVar18 + (this->
                                    super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                                    ).
                                    super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                                    .fd_.band_width_) - 1);
      dVar24 = *pdVar8;
      pdVar8 = data_structures::Matrix<double>::at
                         (&this_00->super_Matrix<double>,0,
                          (this->
                          super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                          ).
                          super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                          .fd_.band_width_ + uVar18);
      *pdVar8 = dVar24 + 1.0;
      uVar18 = uVar18 + 1;
    } while (iVar17 + 1 != uVar18);
  }
  if (e < (int)local_108) {
    pdVar8 = data_structures::Matrix<double>::at
                       (&this_00->super_Matrix<double>,0,
                        (long)e + (this->
                                  super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                                  ).
                                  super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                                  .fd_.band_width_ + 1);
    *pdVar8 = INFINITY;
  }
  iVar14 = e;
  if (iVar2 < e) {
    iVar14 = iVar2;
  }
  if (0 < iVar14) {
    sVar13 = 1;
    do {
      pdVar8 = data_structures::Matrix<double>::read_at
                         (&this_00->super_Matrix<double>,sVar13 - 1,
                          (this->
                          super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                          ).
                          super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                          .fd_.band_width_ - (sVar13 - 1));
      dVar24 = *pdVar8;
      pdVar8 = data_structures::Matrix<double>::at
                         (&this_00->super_Matrix<double>,sVar13,
                          (this->
                          super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                          ).
                          super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                          .fd_.band_width_ - sVar13);
      *pdVar8 = dVar24 + 1.0;
      sVar13 = sVar13 + 1;
    } while (sVar13 != iVar14 + 1);
  }
  if (e < iVar2) {
    pdVar8 = data_structures::Matrix<double>::at
                       (&this_00->super_Matrix<double>,(long)(e + 1),
                        (this->
                        super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                        ).
                        super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                        .fd_.band_width_ - (long)(e + 1));
    *pdVar8 = INFINITY;
  }
  local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  piVar22 = (t1->super_PostLToSubtreeMaxDepth).postl_to_subtree_max_depth_.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  if ((uVar21 < (ulong)((long)(t1->super_PostLToSubtreeMaxDepth).postl_to_subtree_max_depth_.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)piVar22 >> 2)) &&
     (piVar4 = (t1->super_PostLToDepth).postl_to_depth_.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start,
     uVar21 < (ulong)((long)(t1->super_PostLToDepth).postl_to_depth_.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar4 >> 2))) {
    local_f0 = (ulong)(uint)(x - iVar2);
    iVar14 = e + piVar4[uVar21] + 1;
    local_b8 = uVar21;
    if (iVar14 < piVar22[uVar21]) {
      if (0 < iVar2) {
        iVar17 = 1;
        do {
          uVar21 = (ulong)((int)local_f0 + (iVar2 - iVar17) + 1);
          piVar22 = (t1->super_PostLToDepth).postl_to_depth_.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start;
          if ((ulong)((long)(t1->super_PostLToDepth).postl_to_depth_.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar22 >> 2) <= uVar21)
          goto LAB_00104eb5;
          iVar6 = (iVar2 - iVar17) + 1;
          iVar3 = piVar22[uVar21];
          local_d0[0] = (double)CONCAT44(local_d0[0]._4_4_,iVar6);
          if (local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&local_128,
                       (iterator)
                       local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(int *)local_d0);
          }
          else {
            *local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish = iVar6;
            local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
          iVar6 = 1;
          if (iVar3 == iVar14) {
            piVar22 = (t1->super_PostLToSize).postl_to_size_.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start;
            if ((ulong)((long)(t1->super_PostLToSize).postl_to_size_.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)piVar22 >> 2) <= uVar21)
            goto LAB_00104eb5;
            iVar6 = piVar22[uVar21];
          }
          iVar17 = iVar17 + iVar6;
        } while (iVar17 <= iVar2);
      }
    }
    else {
      local_d0[0] = (double)CONCAT44(local_d0[0]._4_4_,iVar2);
      if (0 < iVar2) {
        iVar14 = iVar2;
        do {
          if (local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_128,
                       (iterator)
                       local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(int *)local_d0);
          }
          else {
            *local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish = iVar14;
            local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
          iVar17 = local_d0[0]._0_4_;
          iVar14 = local_d0[0]._0_4_ + -1;
          local_d0[0] = (double)CONCAT44(local_d0[0]._4_4_,iVar14);
        } while (1 < iVar17);
      }
    }
    local_48 = (double)e;
    uStack_40 = 0;
    lVar12 = local_108;
    if (local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish !=
        local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      local_98 = (ulong)(uint)~e;
      local_68 = &(this->
                  super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                  ).
                  super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                  .td_.super_Matrix<double>;
      local_b0 = (ulong)(e + 1);
      local_a0 = (ulong)((int)local_f0 - 1);
      local_70 = (ulong)(uint)((int)local_100 - (int)local_108);
      local_f8 = (ulong)(uint)((((int)local_f8 + (int)local_108) - iVar2) - (int)local_100);
      piVar22 = local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
      do {
        iVar14 = piVar22[-1];
        sVar13 = (size_t)iVar14;
        if (e - iVar14 < -1) {
          pdVar8 = data_structures::Matrix<double>::at
                             (&this_00->super_Matrix<double>,sVar13,
                              ((long)((int)local_98 + iVar14) - sVar13) +
                              (this->
                              super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                              ).
                              super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                              .fd_.band_width_);
          *pdVar8 = INFINITY;
        }
        uVar7 = iVar14 - e;
        if ((int)uVar7 < 2) {
          uVar7 = 1;
        }
        local_dc = e + iVar14;
        uVar20 = local_dc;
        if ((int)(uint)lVar12 < (int)local_dc) {
          uVar20 = (uint)lVar12;
        }
        local_88 = piVar22;
        if ((int)uVar7 <= (int)uVar20) {
          local_60 = (size_t)((int)local_f0 + iVar14);
          local_90 = (ulong)((int)local_a0 + iVar14);
          local_78 = (size_t)(iVar14 + -1);
          uVar18 = (ulong)uVar7;
          local_58 = (ulong)uVar20;
          uVar21 = (ulong)(uVar20 + 1);
          local_100 = -sVar13;
          iVar17 = ((int)local_f8 + iVar14) - uVar7;
          local_80 = -local_78;
          do {
            if ((iVar14 == iVar2) && (local_58 == uVar18)) break;
            plVar1 = &(this->
                      super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                      ).
                      super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                      .
                      super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                      .subproblem_counter_;
            *plVar1 = *plVar1 + 1;
            iVar3 = -iVar17;
            if (0 < iVar17) {
              iVar3 = iVar17;
            }
            sVar19 = (this->
                     super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                     ).
                     super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                     .fd_.band_width_;
            if (local_d4 < iVar3) {
              pdVar8 = data_structures::Matrix<double>::at
                                 (&this_00->super_Matrix<double>,sVar13,sVar19 + local_100 + uVar18)
              ;
              *pdVar8 = INFINITY;
            }
            else {
              lVar12 = local_100 + uVar18;
              local_d8 = iVar17;
              pdVar8 = data_structures::Matrix<double>::read_at
                                 (&this_00->super_Matrix<double>,sVar13,(sVar19 - 1) + lVar12);
              sVar19 = local_60;
              lVar16 = (long)((int)local_70 + (int)uVar18);
              local_50 = *pdVar8 + 1.0;
              if (INFINITY <= local_50) {
                local_50 = INFINITY;
              }
              pdVar8 = data_structures::Matrix<double>::read_at
                                 (local_68,local_60,
                                  (lVar16 - local_60) +
                                  (this->
                                  super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                                  ).
                                  super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                                  .td_.band_width_);
              iVar17 = local_d8;
              dVar24 = *pdVar8;
              iVar3 = (t1->super_PostLToSize).postl_to_size_.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start[sVar19];
              if ((iVar14 != iVar3) ||
                 (dVar23 = 0.0,
                 uVar18 != (uint)(local_e8->super_PostLToSize).postl_to_size_.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[lVar16])) {
                lVar16 = (long)(local_e8->super_PostLToSize).postl_to_size_.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[lVar16];
                lVar11 = uVar18 - lVar16;
                uVar7 = ~(e + iVar3) + iVar14;
                uVar15 = (ulong)uVar7;
                if ((int)uVar7 < 1) {
                  uVar15 = 0;
                }
                dVar23 = INFINITY;
                if ((long)uVar15 <= lVar11) {
                  iVar6 = (int)local_b0 + (iVar14 - iVar3);
                  if ((int)local_108 < iVar6) {
                    iVar6 = (int)local_108;
                  }
                  dVar23 = INFINITY;
                  if (lVar11 <= iVar6) {
                    pdVar8 = data_structures::Matrix<double>::read_at
                                       (&this_00->super_Matrix<double>,(long)(iVar14 - iVar3),
                                        (((long)iVar3 +
                                         (this->
                                         super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                                         ).
                                         super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                                         .fd_.band_width_) - lVar16) + lVar12);
                    dVar23 = *pdVar8;
                  }
                }
              }
              dVar25 = dVar24 + dVar23;
              if (local_50 <= dVar24 + dVar23) {
                dVar25 = local_50;
              }
              dVar24 = dVar25;
              if (iVar14 == 1) {
LAB_00104c1e:
                pdVar8 = data_structures::Matrix<double>::read_at
                                   (&this_00->super_Matrix<double>,local_78,
                                    local_80 + uVar18 +
                                    (this->
                                    super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                                    ).
                                    super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                                    .fd_.band_width_);
                dVar24 = *pdVar8 + 1.0;
                if (dVar25 <= *pdVar8 + 1.0) {
                  dVar24 = dVar25;
                }
              }
              else if (1 < iVar14) {
                piVar22 = (t1->super_PostLToDepth).postl_to_depth_.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                if ((ulong)((long)(t1->super_PostLToDepth).postl_to_depth_.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish - (long)piVar22 >> 2) <=
                    local_90) {
                  std::__throw_out_of_range_fmt
                            (
                            "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                            );
                  goto LAB_00104eb5;
                }
                if (piVar22[local_90] - piVar22[local_b8] <= (int)local_b0) goto LAB_00104c1e;
              }
              sVar19 = lVar12 + (this->
                                super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                                ).
                                super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                                .fd_.band_width_;
              if (dVar24 <= local_48) {
                pdVar8 = data_structures::Matrix<double>::at
                                   (&this_00->super_Matrix<double>,sVar13,sVar19);
                *pdVar8 = dVar24;
              }
              else {
                pdVar8 = data_structures::Matrix<double>::at
                                   (&this_00->super_Matrix<double>,sVar13,sVar19);
                *pdVar8 = INFINITY;
              }
            }
            uVar18 = uVar18 + 1;
            iVar17 = iVar17 + -1;
          } while (uVar21 != uVar18);
        }
        piVar5 = local_88;
        lVar12 = local_108;
        if ((int)local_dc < (int)local_108) {
          pdVar8 = data_structures::Matrix<double>::at
                             (&this_00->super_Matrix<double>,sVar13,
                              ((long)(int)(local_dc + 1) - sVar13) +
                              (this->
                              super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                              ).
                              super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                              .fd_.band_width_);
          *pdVar8 = INFINITY;
        }
        piVar22 = piVar5 + -1;
      } while (piVar22 !=
               local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start);
    }
    sVar19 = (size_t)iVar2;
    plVar1 = &(this->
              super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
              ).
              super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
              .
              super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
              .subproblem_counter_;
    *plVar1 = *plVar1 + 1;
    sVar13 = sVar19 - 1;
    pdVar8 = data_structures::Matrix<double>::read_at
                       (&this_00->super_Matrix<double>,sVar13,
                        (lVar12 - sVar13) +
                        (this->
                        super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                        ).
                        super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                        .fd_.band_width_);
    local_d0[0] = *pdVar8 + 1.0;
    pdVar8 = data_structures::Matrix<double>::read_at
                       (&this_00->super_Matrix<double>,sVar19,
                        ((lVar12 + -1) - sVar19) +
                        (this->
                        super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                        ).
                        super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                        .fd_.band_width_);
    local_d0[1] = *pdVar8 + 1.0;
    pdVar8 = data_structures::Matrix<double>::read_at
                       (&this_00->super_Matrix<double>,sVar13,
                        ((lVar12 + -1) - sVar13) +
                        (this->
                        super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                        ).
                        super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                        .fd_.band_width_);
    dVar24 = 0.0;
    if ((t1->super_PostLToLabelId).postl_to_label_id_.super__Vector_base<int,_std::allocator<int>_>.
        _M_impl.super__Vector_impl_data._M_start[local_b8] !=
        (local_e8->super_PostLToLabelId).postl_to_label_id_.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [local_a8]) {
      dVar24 = 1.0;
    }
    pdVar9 = local_d0;
    local_d0[2] = dVar24 + *pdVar8;
    lVar12 = 8;
    do {
      if (*(double *)((long)local_d0 + lVar12) <= *pdVar9 &&
          *pdVar9 != *(double *)((long)local_d0 + lVar12)) {
        pdVar9 = (double *)((long)local_d0 + lVar12);
      }
      lVar12 = lVar12 + 8;
    } while (lVar12 != 0x18);
    dVar24 = *pdVar9;
    if (local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (int *)0x0) {
      operator_delete(local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    uVar21 = -(ulong)(local_48 < dVar24);
    return (double)(~uVar21 & (ulong)dVar24 | uVar21 & 0x7ff0000000000000);
  }
LAB_00104ec6:
  uVar10 = std::__throw_out_of_range_fmt
                     ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                      uVar21);
  if (local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  _Unwind_Resume(uVar10);
LAB_00104eb5:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar21);
  goto LAB_00104ec6;
}

Assistant:

double TouzetDepthPruningTruncatedTreeFixTreeIndex<CostModel, TreeIndex>::tree_dist(
    const TreeIndex& t1, const TreeIndex& t2, const int x,
    const int y, const int k, const int e) {
  
  int x_size = t1.postl_to_size_[x];
  int y_size = t2.postl_to_size_[y];

  // Calculates offsets that let us translate i and j to correct postorder ids.
  int x_off = x - x_size;
  int y_off = y - y_size;

  // Initial cases.
  fd_.at(0, 0) = 0.0; // (0,0) is always within e-strip.
  for (int j = 1; j <= std::min(y_size, e); ++j) { // i = 0; only j that are within e-strip.
    fd_.at(0, j) = fd_.read_at(0, j - 1) + c_.ins(t2.postl_to_label_id_[j + y_off]);
  }
  if (e + 1 <= y_size) { // the first j that is outside e-strip
    fd_.at(0, e + 1) = std::numeric_limits<double>::infinity();
  }
  // QUESTION: Is it necessary to verify depths here?
  //           It is not, because these values will never be used. We write
  //           them not to verify the condition.
  for (int i = 1; i <= std::min(x_size, e); ++i) { // j = 0; only i that are within e-strip.
    fd_.at(i, 0) = fd_.read_at(i - 1, 0) + c_.del(t1.postl_to_label_id_[i + x_off]);
  }
  if (e + 1 <= x_size) { // the first i that is outside e-strip
    fd_.at(e + 1, 0) = std::numeric_limits<double>::infinity();
  }

  double candidate_result = std::numeric_limits<double>::infinity();

  // General cases.

  // NOTE: max_depth has to be set to min(depth(x)+e+1, max depth of T1_x)
  //       because e+1 may exceed the maximum depth of T1_x.
  // TODO: Figure out why e+1.
  int max_depth = 0;

  // Collect all nodes in truncated tree to traverse.
  std::vector<int> nodes_to_traverse; // Normalized to current subtree: 1..|x|.
  // NOTE: If we can't truncate anything, all the nodes from the subtree have
  //       to be traversed.
  if (t1.postl_to_subtree_max_depth_.at(x) <= t1.postl_to_depth_.at(x) + e + 1) {
    max_depth = t1.postl_to_subtree_max_depth_.at(x);
    for (int n = x_size; n >= 1; --n) {
      nodes_to_traverse.push_back(n);
    }
  } else {
    max_depth = t1.postl_to_depth_.at(x) + e + 1;
    int n = 1;
    int post_n = 0;
    int depth_n = 0;
    while (n <= x_size) { // Loop in right-to-left-preorder
      post_n = x_size - n + 1 + x_off;
      depth_n = t1.postl_to_depth_.at(post_n);
      // if (depth_n <= max_depth) { // NOTE: depth_n < max_depth is always satisfied.
        nodes_to_traverse.push_back(x_size - n + 1);
        if (depth_n == max_depth) {// Jump to the next node to the left with the max_depth.
          n += t1.postl_to_size_.at(post_n);
        } else {
          ++n;
        }
      // }
    }
  }

  // Traversing truncated tree to filter out i-values based on depth.
  typename std::vector<int>::reverse_iterator rit = nodes_to_traverse.rbegin();
  int i;
  for (; rit != nodes_to_traverse.rend(); ++rit) {
    i = *rit;
    // Old if statement for filtering i-values based on depth.
    // if (t1_depth_[i + x_off] - t1_depth_[x] > e + 1) { continue; }
    if (i - e - 1 >= 1) { // First j that is outside e-strip.
      fd_.at(i, i - e - 1) = std::numeric_limits<double>::infinity();
    }
    for (int j = std::max(1, i - e); j <= std::min(i + e, y_size); ++j) { // only (i,j) that are in e-strip
      // The td(x_size-1, y_size-1) is computed differently.
      // TODO: This condition is evaluated too often but passes only on the
      //       last i and j.
      if (i == x_size && j == std::min(i + e, y_size)) {
        break;
      }
      ++subproblem_counter_;
      if (std::abs((i + x_off) - (j + y_off)) > k) {
        fd_.at(i, j) = std::numeric_limits<double>::infinity();
      } else {
        candidate_result = std::numeric_limits<double>::infinity();
        candidate_result = std::min(candidate_result, fd_.read_at(i, j - 1) + c_.ins(t2.postl_to_label_id_[j + y_off]));
        double td_read = td_.read_at(i + x_off, j + y_off);
        double fd_read = 0.0;
        // If one of the forests is a tree, look up the vlaues in fd_.
        // Otherwise, both forests are trees and the fd-part is empty.
        if (i - t1.postl_to_size_[i + x_off] != 0 || j - t2.postl_to_size_[j + y_off] != 0) {
          // If the values to read are outside of the band, they exceed
          // the threshold or are not present in the band-matrix.
          if (j - t2.postl_to_size_[j + y_off] < std::max(0, i - t1.postl_to_size_[i + x_off] - e - 1)) {
            fd_read = std::numeric_limits<double>::infinity();
          } else if (std::min(i - t1.postl_to_size_[i + x_off] + e + 1, y_size) < j - t2.postl_to_size_[j + y_off]) {
            fd_read = std::numeric_limits<double>::infinity();
          } else {
            fd_read = fd_.read_at(i - t1.postl_to_size_[i + x_off], j - t2.postl_to_size_[j + y_off]);
          }
        }
        candidate_result = std::min(candidate_result, fd_read + td_read);

        // Value at (i-1,j) may not be calculated due to truncated tree,
        // thus it has to be verified separately.
        // NOTE: For i=1 there may be an out of bound exception for depth
        //       lookup.
        if (i == 1 || (i > 1 && t1.postl_to_depth_.at(i - 1 + x_off) - t1.postl_to_depth_[x] <= e + 1)) {
          candidate_result = std::min(
            candidate_result,
            fd_.read_at(i - 1, j) + c_.del(t1.postl_to_label_id_[i + x_off])
          );
        }

        // None of the values in fd_ can be greater than e-value for this
        // subtree pair.
        if (candidate_result > e) {
          fd_.at(i, j) = std::numeric_limits<double>::infinity();
        } else {
          fd_.at(i, j) = candidate_result;
        }
      }
    }
    if (i + e + 1 <= y_size) { // Last j that is outside e-strip.
      fd_.at(i, i + e + 1) = std::numeric_limits<double>::infinity();
    }
  }

  ++subproblem_counter_;
  // QUESTION: Is it possible that for some e-value an infinity should be
  //           returned, because the last subproblem is too far away?
  candidate_result = std::min({
    fd_.read_at(x_size - 1, y_size) + c_.del(t1.postl_to_label_id_[x]),                 // Delete root in source subtree.
    fd_.read_at(x_size, y_size - 1) + c_.ins(t2.postl_to_label_id_[y]),                 // Insert root in destination subtree.
    fd_.read_at(x_size - 1, y_size - 1) + c_.ren(t1.postl_to_label_id_[x], t2.postl_to_label_id_[y]) // Rename root nodes of the subtrees.
  });
  // The distance between two subtrees cannot be greater than e-value for these
  // subtrees.
  if (candidate_result > e) {
    return std::numeric_limits<double>::infinity();
  } else {
    return candidate_result;
  }
}